

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1144a71::Target::DumpLanguageStandard
          (Value *__return_storage_ptr__,Target *this,
          JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *standard)

{
  bool bVar1;
  Value *pVVar2;
  vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_> *this_00
  ;
  reference pJVar3;
  Value local_d0;
  UInt local_a4;
  const_iterator cStack_a0;
  JBTIndex backtrace;
  const_iterator __end2;
  const_iterator __begin2;
  vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
  *__range2;
  Value backtraces;
  Value local_50;
  undefined1 local_21;
  JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_20;
  JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *standard_local;
  Target *this_local;
  Value *languageStandard;
  
  local_21 = 0;
  local_20 = standard;
  standard_local =
       (JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,&local_20->Value);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"standard");
  Json::Value::operator=(pVVar2,&local_50);
  Json::Value::~Value(&local_50);
  bVar1 = std::
          vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
          ::empty(&local_20->Backtraces);
  if (!bVar1) {
    Json::Value::Value((Value *)&__range2,arrayValue);
    this_00 = &local_20->Backtraces;
    __end2 = std::
             vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
             ::begin(this_00);
    cStack_a0 = std::
                vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff60), bVar1) {
      pJVar3 = __gnu_cxx::
               __normal_iterator<const_(anonymous_namespace)::JBTIndex_*,_std::vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>_>
               ::operator*(&__end2);
      local_a4 = pJVar3->Index;
      Json::Value::Value(&local_d0,local_a4);
      Json::Value::append((Value *)&__range2,&local_d0);
      Json::Value::~Value(&local_d0);
      __gnu_cxx::
      __normal_iterator<const_(anonymous_namespace)::JBTIndex_*,_std::vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>_>
      ::operator++(&__end2);
    }
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"backtraces");
    Json::Value::operator=(pVVar2,(Value *)&__range2);
    Json::Value::~Value((Value *)&__range2);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLanguageStandard(JBTs<std::string> const& standard)
{
  Json::Value languageStandard = Json::objectValue;
  languageStandard["standard"] = standard.Value;
  if (!standard.Backtraces.empty()) {
    Json::Value backtraces = Json::arrayValue;
    for (JBTIndex backtrace : standard.Backtraces) {
      backtraces.append(backtrace.Index);
    }
    languageStandard["backtraces"] = backtraces;
  }
  return languageStandard;
}